

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O2

bool __thiscall
ON_Leader::GetTextXform
          (ON_Leader *this,ON_Xform *model_xform,ON_Viewport *vp,ON_DimStyle *dimstyle,
          double dimscale,ON_Xform *text_xform_out)

{
  ON_2dPoint *pOVar1;
  double dVar2;
  ON_3dVector axis;
  ON_3dPoint point_on_mirror_plane;
  ON_3dPoint point_on_mirror_plane_00;
  ON_3dPoint center;
  ON_3dVector normal_to_mirror_plane;
  ON_3dVector normal_to_mirror_plane_00;
  ON_Leader *this_00;
  MaskFrame MVar3;
  ContentAngleStyle CVar4;
  TextHorizontalAlignment halign;
  TextVerticalAlignment TVar5;
  TextHorizontalAlignment TVar6;
  bool bVar7;
  TextOrientation TVar8;
  view_projection vVar9;
  ON_TextContent *this_01;
  ON_Plane *pOVar10;
  wchar_t *pwVar11;
  ON_TextMask *this_02;
  ON_Plane *pOVar12;
  long lVar13;
  long lVar14;
  ON_3dPoint *pOVar15;
  ON_Xform *pOVar16;
  ON_wString *pOVar17;
  ON_Xform *pOVar18;
  byte bVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined4 uVar22;
  double dVar23;
  ON_2dVector OVar24;
  ON_2dPoint OVar25;
  ON_2dPoint OVar26;
  bool flip_y;
  bool flip_x;
  double local_5e0;
  ON_2dPoint local_5d8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  ON_Leader *local_5a0;
  ON_2dVector local_598;
  ON_2dVector tail_dir;
  ON_3dVector view_x;
  ON_3dVector text_ydir;
  ON_3dVector text_xdir;
  ON_3dVector view_y;
  ON_Xform mxf;
  ON_3dVector text_zdir;
  ON_wString rtfstr;
  ON_3dVector view_z;
  ON_2dPoint text_corners [4];
  ON_Xform textrotation_xf;
  ON_3dPoint text_point_3d;
  ON_2dPoint text_pt;
  ON_Xform textcenter_xf;
  ON_Xform leader_to_text_pt_xf;
  ON_Plane objectplane;
  ON_Xform world_to_leader_xf;
  
  bVar19 = 0;
  if ((dimstyle == (ON_DimStyle *)0x0) ||
     (this_01 = ON_Annotation::Text(&this->super_ON_Annotation), this_01 == (ON_TextContent *)0x0))
  goto LAB_004de4f6;
  MVar3 = ON_DimStyle::MaskFrameType(dimstyle);
  local_5b0 = (double)CONCAT71(local_5b0._1_7_,MVar3);
  CVar4 = ON_DimStyle::LeaderContentAngleStyle(dimstyle);
  local_5a0 = this;
  OVar24 = TailDirection(this,dimstyle);
  tail_dir.y = OVar24.y;
  tail_dir.x = OVar24.x;
  if (vp == (ON_Viewport *)0x0) {
    view_x.z = ON_3dVector::XAxis.z;
    view_x.x = ON_3dVector::XAxis.x;
    view_x.y = ON_3dVector::XAxis.y;
    view_y.z = ON_3dVector::YAxis.z;
    view_y.x = ON_3dVector::YAxis.x;
    view_y.y = ON_3dVector::YAxis.y;
  }
  else {
    ON_Viewport::CameraX(vp);
    ON_Viewport::CameraY(vp);
  }
  ON_CrossProduct(&view_z,&view_x,&view_y);
  pOVar10 = ON_Annotation::Plane(&local_5a0->super_ON_Annotation);
  pOVar12 = &objectplane;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pOVar12->origin).x = (pOVar10->origin).x;
    pOVar10 = (ON_Plane *)((long)pOVar10 + (ulong)bVar19 * -0x10 + 8);
    pOVar12 = (ON_Plane *)((long)pOVar12 + (ulong)bVar19 * -0x10 + 8);
  }
  halign = ON_DimStyle::LeaderTextHorizontalAlignment(dimstyle);
  TVar5 = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
  if (halign == Auto) {
    dVar23 = ON_3dVector::operator*(&objectplane.xaxis,&view_x);
    halign = ((double)(~-(ulong)(tail_dir.x < -1e-05) & (ulong)dVar23 |
                      (ulong)-dVar23 & -(ulong)(tail_dir.x < -1e-05)) <= -1e-05) * '\x02';
  }
  TVar6 = ON_TextContent::RuntimeHorizontalAlignment(this_01);
  ON_TextContent::SetRuntimeHorizontalAlignment(this_01,halign);
  if (TVar6 != halign) {
    ON_TextContent::SetAlignment(this_01,halign,TVar5);
  }
  ON_Annotation::DimStyleTextPositionPropertiesHash
            ((ON_SHA1_Hash *)&rtfstr,&local_5a0->super_ON_Annotation);
  ON_DimStyle::TextPositionPropertiesHash((ON_SHA1_Hash *)&textcenter_xf,dimstyle);
  bVar7 = ::operator!=((ON_SHA1_Hash *)&rtfstr,(ON_SHA1_Hash *)&textcenter_xf);
  if (bVar7) {
    pwVar11 = ON_TextContent::RtfText(this_01);
    ON_wString::ON_wString(&rtfstr,pwVar11);
    pwVar11 = ON_wString::operator_cast_to_wchar_t_(&rtfstr);
    bVar7 = ON_TextContent::TextIsWrapped(this_01);
    local_5e0 = ON_TextContent::FormattingRectangleWidth(this_01);
    dVar23 = ON_TextContent::TextRotationRadians(this_01);
    ON_TextContent::Create(this_01,pwVar11,Leader,dimstyle,bVar7,local_5e0,dVar23);
    ON_TextContent::SetAlignment(this_01,halign,TVar5);
    ON_wString::~ON_wString(&rtfstr);
  }
  ON_2dPoint::ON_2dPoint(&text_pt,0.0,0.0);
  bVar7 = ON_TextContent::Get2dCorners(this_01,text_corners);
  if (!bVar7) goto LAB_004de4e9;
  OVar25 = ON_2dPoint::operator+(text_corners,text_corners + 2);
  rtfstr.m_s = (wchar_t *)OVar25.x;
  OVar26 = ON_2dPoint::operator/((ON_2dPoint *)&rtfstr,2.0);
  dVar23 = text_corners[1].x - text_corners[0].x;
  local_5c0 = text_corners[3].y - text_corners[0].y;
  local_5e0 = ON_DimStyle::TextHeight(dimstyle);
  local_5b8 = 0.0;
  if (local_5b0._0_1_ == '\x02') goto switchD_004ddab3_caseD_3;
  TVar5 = ON_DimStyle::LeaderTextVerticalAlignment(dimstyle);
  switch(TVar5) {
  case Top:
    uVar21 = 0xbfe00000;
    goto LAB_004ddb4c;
  case MiddleOfTop:
    local_5b8 = local_5e0 * 0.5 - local_5c0 * 0.5;
    break;
  case BottomOfTop:
    dVar2 = local_5c0 * -0.5;
    local_5b8 = local_5e0;
    goto LAB_004ddaee;
  case MiddleOfBottom:
    local_5b8 = local_5c0 * 0.5 - local_5e0 * 0.5;
    break;
  case Bottom:
    uVar21 = 0x3fe00000;
LAB_004ddb4c:
    local_5b8 = (double)((ulong)uVar21 << 0x20) * local_5c0;
    break;
  case BottomOfBoundingBox:
    dVar2 = ON_DimStyle::TextGap(dimstyle);
    local_5b8 = local_5c0 * 0.5;
LAB_004ddaee:
    local_5b8 = local_5b8 + dVar2;
  }
switchD_004ddab3_caseD_3:
  ON_2dPoint::ON_2dPoint(&local_5d8,0.0,0.0);
  lVar13 = (long)(local_5a0->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (0 < lVar13) {
    pOVar1 = (local_5a0->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a + lVar13 + -1;
    local_5d8.x = pOVar1->x;
    local_5d8.y = pOVar1->y;
  }
  bVar7 = ON_DimStyle::LeaderHasLanding(dimstyle);
  local_5a8 = 0.0;
  if (bVar7) {
    local_5a8 = ON_DimStyle::LeaderLandingLength(dimstyle);
  }
  local_5e0 = ON_DimStyle::TextGap(dimstyle);
  if (local_5b0._0_1_ == '\0') {
LAB_004ddd4a:
    OVar24 = ON_2dVector::operator*(&tail_dir,(dVar23 * 0.5 + local_5a8 + local_5e0) * dimscale);
    rtfstr.m_s = (wchar_t *)OVar24.x;
    OVar25 = ON_2dPoint::operator+(&local_5d8,(ON_2dVector *)&rtfstr);
    local_5d8.y = OVar25.y;
    uVar20 = OVar25.x._0_4_;
    uVar22 = OVar25.x._4_4_;
  }
  else {
    this_02 = ON_DimStyle::TextMask(dimstyle);
    dVar2 = ON_TextMask::MaskBorder(this_02);
    local_5e0 = local_5e0 + dVar2;
    if (local_5b0._0_1_ != '\x02') goto LAB_004ddd4a;
    dVar2 = (local_5c0 * 0.5 + local_5e0) * dimscale;
    ON_2dVector::ON_2dVector((ON_2dVector *)&rtfstr,dVar2,dVar2);
    local_5b0 = ON_2dVector::Length((ON_2dVector *)&rtfstr);
    uVar20 = SUB84(local_5b0,0);
    uVar22 = (undefined4)((ulong)local_5b0 >> 0x20);
    if (0.0 < local_5a8) {
      ON_2dVector::ON_2dVector
                ((ON_2dVector *)&rtfstr,*(double *)(&DAT_006924c0 + (ulong)(tail_dir.x < 0.0) * 8),
                 0.0);
      tail_dir.x = (double)rtfstr.m_s;
      tail_dir.y = OVar25.y;
      OVar24 = ON_2dVector::operator*(&tail_dir,local_5a8);
      rtfstr.m_s = (wchar_t *)OVar24.x;
      OVar25 = ON_2dPoint::operator+(&local_5d8,(ON_2dVector *)&rtfstr);
      local_5d8.y = OVar25.y;
      local_5d8.x = OVar25.x;
      uVar20 = SUB84(local_5b0,0);
      uVar22 = (undefined4)((ulong)local_5b0 >> 0x20);
    }
    if (((CVar4 != Aligned) || (local_5a8 != 0.0)) || (NAN(local_5a8))) {
      if ((0.1 < ABS(tail_dir.x)) && (local_5c0 < dVar23)) {
        dVar23 = (dVar23 * 0.5 + local_5e0) - (double)CONCAT44(uVar22,uVar20) * 0.5;
        if (tail_dir.x <= 0.0) {
          local_5d8.x = local_5d8.x - dVar23;
        }
        else {
          local_5d8.x = dVar23 + local_5d8.x;
        }
      }
    }
    else {
      OVar24 = ON_2dVector::operator*
                         (&tail_dir,
                          (dVar23 * 0.5 + local_5e0) - (double)CONCAT44(uVar22,uVar20) * 0.5);
      rtfstr.m_s = (wchar_t *)OVar24.x;
      OVar25 = ON_2dPoint::operator+(&local_5d8,(ON_2dVector *)&rtfstr);
      local_5d8.y = OVar25.y;
      local_5d8.x = OVar25.x;
      uVar20 = SUB84(local_5b0,0);
      uVar22 = (undefined4)((ulong)local_5b0 >> 0x20);
    }
    OVar24 = ON_2dVector::operator*(&tail_dir,(double)CONCAT44(uVar22,uVar20));
    rtfstr.m_s = (wchar_t *)OVar24.x;
    OVar25 = ON_2dPoint::operator+(&local_5d8,(ON_2dVector *)&rtfstr);
    local_5d8.y = OVar25.y;
    uVar20 = OVar25.x._0_4_;
    uVar22 = OVar25.x._4_4_;
  }
  local_5d8.x = (double)CONCAT44(uVar22,uVar20);
  pOVar10 = ON_Annotation::Plane(&local_5a0->super_ON_Annotation);
  ON_2dVector::ON_2dVector(&local_598,1.0,0.0);
  if (CVar4 == Rotated) {
    local_598.x = tail_dir.x;
    local_598.y = tail_dir.y;
  }
  else if (CVar4 == Aligned) {
    local_598.x = tail_dir.x;
    local_598.y = tail_dir.y;
    if (tail_dir.x < 0.0) {
      OVar24 = ON_2dVector::operator-(&local_598);
      local_598.y = OVar24.y;
      local_598.x = OVar24.x;
    }
  }
  bVar7 = ON_2dVector::Unitize(&local_598);
  if (!bVar7) {
    ON_2dVector::Set(&local_598,1.0,0.0);
  }
  ON_Xform::DiagonalTransformation((ON_Xform *)&rtfstr,dimscale);
  lVar13 = 0x10;
  pOVar16 = &ON_Xform::IdentityTransformation;
  pOVar18 = &textcenter_xf;
  for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
    pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  pOVar16 = &ON_Xform::IdentityTransformation;
  pOVar18 = &textrotation_xf;
  for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
    pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  pOVar16 = &ON_Xform::IdentityTransformation;
  pOVar18 = &world_to_leader_xf;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  ON_Xform::Rotation(&world_to_leader_xf,&ON_Plane::World_xy,pOVar10);
  pOVar16 = &ON_Xform::IdentityTransformation;
  pOVar18 = &leader_to_text_pt_xf;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  ON_2dVector::ON_2dVector((ON_2dVector *)&text_point_3d,&local_5d8);
  ON_Xform::TranslationTransformation(&mxf,(ON_2dVector *)&text_point_3d);
  pOVar16 = &mxf;
  pOVar18 = &leader_to_text_pt_xf;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
  }
  axis.y = ON_3dVector::ZAxis.y;
  axis.x = ON_3dVector::ZAxis.x;
  axis.z = ON_3dVector::ZAxis.z;
  center.y = ON_3dPoint::Origin.y;
  center.x = ON_3dPoint::Origin.x;
  center.z = ON_3dPoint::Origin.z;
  ON_Xform::Rotation(&textrotation_xf,local_598.y,local_598.x,axis,center);
  textcenter_xf.m_xform[0][3] = -OVar26.x;
  textcenter_xf.m_xform[1][3] = local_5b8 - OVar26.y;
  TVar8 = ON_DimStyle::LeaderTextOrientation(dimstyle);
  this_00 = local_5a0;
  if (TVar8 == InView) {
    pOVar10 = ON_Annotation::Plane(&local_5a0->super_ON_Annotation);
    pOVar12 = ON_Annotation::Plane(&this_00->super_ON_Annotation);
    ON_Plane::PointAt(&text_point_3d,pOVar12,local_5d8.x,local_5d8.y);
    ON_Xform::Rotation(&textrotation_xf,&text_point_3d,&pOVar10->xaxis,&pOVar10->yaxis,
                       &pOVar10->zaxis,&text_point_3d,&view_x,&view_y,&view_z);
    ON_Xform::operator*(&mxf,(ON_Xform *)&rtfstr,&textcenter_xf);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&leader_to_text_pt_xf,text_xform_out);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&world_to_leader_xf,text_xform_out);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&textrotation_xf,text_xform_out);
  }
  else {
    bVar7 = ON_DimStyle::DrawForward(dimstyle);
    if ((bVar7) && (bVar7 = ON_DimStyle::DrawForward(dimstyle), bVar7)) {
      text_xdir.z = (pOVar10->xaxis).z;
      text_xdir.x = (pOVar10->xaxis).x;
      text_xdir.y = (pOVar10->xaxis).y;
      text_ydir.z = (pOVar10->yaxis).z;
      text_ydir.x = (pOVar10->yaxis).x;
      text_ydir.y = (pOVar10->yaxis).y;
      text_zdir.z = (pOVar10->zaxis).z;
      text_zdir.x = (pOVar10->zaxis).x;
      text_zdir.y = (pOVar10->zaxis).y;
      dVar23 = ON_3dVector::operator*(&text_zdir,&view_z);
      if (0.0 <= dVar23) {
        ON_3dVector::Transform(&text_xdir,&textrotation_xf);
        ON_3dVector::Transform(&text_ydir,&textrotation_xf);
        ON_3dVector::Transform(&text_zdir,&textrotation_xf);
      }
      else {
        ON_Xform::Inverse(&mxf,&textrotation_xf,(double *)0x0);
        ON_3dVector::Transform(&text_xdir,&mxf);
        ON_3dVector::Transform(&text_ydir,&mxf);
        ON_3dVector::Transform(&text_zdir,&mxf);
      }
      if (model_xform != (ON_Xform *)0x0) {
        ON_3dVector::Transform(&text_xdir,model_xform);
        ON_3dVector::Transform(&text_ydir,model_xform);
        ON_3dVector::Transform(&text_zdir,model_xform);
      }
      flip_x = false;
      flip_y = false;
      if (vp == (ON_Viewport *)0x0) {
LAB_004de2f2:
        uVar20 = 0xc9f7dc37;
        uVar22 = 0x3fa1de58;
      }
      else {
        vVar9 = ON_Viewport::Projection(vp);
        uVar20 = 0;
        uVar22 = 0;
        if (vVar9 != perspective_view) goto LAB_004de2f2;
      }
      ON_Annotation::CalcTextFlip
                (&text_xdir,&text_ydir,&text_zdir,&view_x,&view_y,&view_z,model_xform,
                 (double)CONCAT44(uVar22,uVar20),&flip_x,&flip_y);
      ON_Xform::ON_Xform(&mxf);
      if (flip_x == true) {
        point_on_mirror_plane.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane.y = ON_3dVector::XAxis.y;
        normal_to_mirror_plane.x = ON_3dVector::XAxis.x;
        normal_to_mirror_plane.z = ON_3dVector::XAxis.z;
        ON_Xform::Mirror(&mxf,point_on_mirror_plane,normal_to_mirror_plane);
        ON_Xform::operator*((ON_Xform *)&text_point_3d,(ON_Xform *)&rtfstr,&mxf);
        pOVar15 = &text_point_3d;
        pOVar17 = &rtfstr;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pOVar17->m_s = (wchar_t *)pOVar15->x;
          pOVar15 = (ON_3dPoint *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar17 = pOVar17 + (ulong)bVar19 * -2 + 1;
        }
      }
      if (flip_y == true) {
        point_on_mirror_plane_00.y = ON_3dPoint::Origin.y;
        point_on_mirror_plane_00.x = ON_3dPoint::Origin.x;
        point_on_mirror_plane_00.z = ON_3dPoint::Origin.z;
        normal_to_mirror_plane_00.y = ON_3dVector::YAxis.y;
        normal_to_mirror_plane_00.x = ON_3dVector::YAxis.x;
        normal_to_mirror_plane_00.z = ON_3dVector::YAxis.z;
        ON_Xform::Mirror(&mxf,point_on_mirror_plane_00,normal_to_mirror_plane_00);
        ON_Xform::operator*((ON_Xform *)&text_point_3d,(ON_Xform *)&rtfstr,&mxf);
        pOVar15 = &text_point_3d;
        pOVar17 = &rtfstr;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pOVar17->m_s = (wchar_t *)pOVar15->x;
          pOVar15 = (ON_3dPoint *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar17 = pOVar17 + (ulong)bVar19 * -2 + 1;
        }
      }
    }
    ON_Xform::operator*(&mxf,(ON_Xform *)&rtfstr,&textcenter_xf);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&textrotation_xf,text_xform_out);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&leader_to_text_pt_xf,text_xform_out);
    pOVar16 = &mxf;
    pOVar18 = text_xform_out;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar18->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    ON_Xform::operator*(&mxf,&world_to_leader_xf,text_xform_out);
  }
  pOVar16 = &mxf;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    text_xform_out->m_xform[0][0] = pOVar16->m_xform[0][0];
    pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar19 * -2 + 1) * 8);
    text_xform_out = (ON_Xform *)((long)text_xform_out + ((ulong)bVar19 * -2 + 1) * 8);
  }
LAB_004de4e9:
  ON_Plane::~ON_Plane(&objectplane);
LAB_004de4f6:
  return dimstyle != (ON_DimStyle *)0x0;
}

Assistant:

bool ON_Leader::GetTextXform(
  const ON_Xform* model_xform,
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Xform& text_xform_out
) const
{
  if (nullptr == dimstyle)
    return false;

  const ON_TextContent* text = Text();
  if (nullptr == text)
    return true;

  const ON_TextMask::MaskFrame maskframe = dimstyle->MaskFrameType();
  const ON_DimStyle::ContentAngleStyle textangle_style = dimstyle->LeaderContentAngleStyle();

  ON_2dVector tail_dir = TailDirection(dimstyle);
  ON_3dVector view_x = nullptr == vp ? ON_3dVector::XAxis : vp->CameraX();
  ON_3dVector view_y = nullptr == vp ? ON_3dVector::YAxis : vp->CameraY();
  ON_3dVector view_z = ON_CrossProduct(view_x, view_y);
  ON_Plane objectplane = Plane();
  ON::TextHorizontalAlignment halign = dimstyle->LeaderTextHorizontalAlignment();
  ON::TextVerticalAlignment valign = dimstyle->LeaderTextVerticalAlignment();
  if (ON::TextHorizontalAlignment::Auto == halign)
  {
    double xdotx = objectplane.xaxis * view_x;
    if (tail_dir.x < -0.00001)
      xdotx = -xdotx;
    if (xdotx > -0.00001)
      halign = ON::TextHorizontalAlignment::Left;
    else
      halign = ON::TextHorizontalAlignment::Right;
  }
  ON::TextHorizontalAlignment last_halign = text->RuntimeHorizontalAlignment();
  text->SetRuntimeHorizontalAlignment(halign);

  if (last_halign != halign)
  {
    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }
  if (DimStyleTextPositionPropertiesHash() != dimstyle->TextPositionPropertiesHash())
  {
    ON_wString rtfstr = text->RtfText();
    const_cast<ON_TextContent*>(text)->Create(
      rtfstr, ON::AnnotationType::Leader, dimstyle,
      text->TextIsWrapped(), text->FormattingRectangleWidth(), text->TextRotationRadians());

    const_cast<ON_TextContent*>(text)->SetAlignment(halign, valign);
  }

  // Find center of scaled text
  double textblock_width = 0.0;
  double textblock_height = 0.0;
  double line_height = 1.0;

  ON_2dPoint text_corners[4];
  ON_2dPoint text_center;
  ON_2dPoint text_pt(0.0, 0.0);
  if (text->Get2dCorners(text_corners)) // Gets unscaled 3d size
  {
    text_center = (text_corners[0] + text_corners[2]) / 2.0;
    textblock_width = (text_corners[1].x - text_corners[0].x);
    textblock_height = (text_corners[3].y - text_corners[0].y);
    line_height = dimstyle->TextHeight();

    ON_2dVector text_shift;
    text_shift.x = 0.0;
    text_shift.y = 0.0;

    if (ON_TextMask::MaskFrame::CapsuleFrame != maskframe)
    {
      // LeaderAttachStyle - Vertical alignment of text with leader text point
      ON::TextVerticalAlignment attach = dimstyle->LeaderTextVerticalAlignment();
      switch (attach)
      {
      case ON::TextVerticalAlignment::Top:
        text_shift.y = -textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfTop:
        text_shift.y = -(textblock_height / 2.0) + (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::BottomOfTop:
        text_shift.y = -(textblock_height / 2.0) + line_height;
        break;
      case ON::TextVerticalAlignment::Middle:
        text_shift.y = 0.0;
        break;
      case ON::TextVerticalAlignment::MiddleOfBottom:
        text_shift.y = (textblock_height / 2.0) - (line_height / 2.0);
        break;
      case ON::TextVerticalAlignment::Bottom:
        text_shift.y = textblock_height / 2.0;
        break;
      case ON::TextVerticalAlignment::BottomOfBoundingBox:
        text_shift.y = (textblock_height / 2.0) + (dimstyle->TextGap());   /*(line_height / 10.0);*/
        break;
      }
    }

    // 2d Point at center of text but without vertical alignment shift
    ON_2dPoint text_pt2(0.0, 0.0);
    if (0 < m_points.Count())
      text_pt2 = m_points[m_points.Count() - 1];

    double landing_length = 0.0;
    if (dimstyle->LeaderHasLanding())
      landing_length = dimstyle->LeaderLandingLength();
    double text_gap = dimstyle->TextGap();

    if (maskframe != ON_TextMask::MaskFrame::NoFrame)
    {
      text_gap += dimstyle->TextMask().MaskBorder(); // RH-71452
    }

    if (maskframe == ON_TextMask::MaskFrame::CapsuleFrame)
    {
      double half_height = dimscale * (textblock_height * 0.5 + text_gap);
      double radius = ON_2dVector(half_height, half_height).Length();
      if (landing_length > 0.0)
      {
        tail_dir = tail_dir.x < 0 ? ON_2dVector(-1, 0) : ON_2dVector(1, 0);
        text_pt2 = text_pt2 + (tail_dir * landing_length);
      }

      if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style && landing_length == 0.0)
      {
        text_pt2 = text_pt2 + (tail_dir * (textblock_width * 0.5 + text_gap - radius * 0.5));
      }
      else if (fabs(tail_dir.x) > 0.1 && textblock_width > textblock_height)
      {
        if (tail_dir.x > 0)
        {
          text_pt2.x += (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
        else
        {
          text_pt2.x -= (textblock_width * 0.5 + text_gap - radius * 0.5);
        }
      }
      text_pt2 = text_pt2 + (tail_dir * radius);
    }
    else
    {
      double x_offset = dimscale * (landing_length + text_gap + textblock_width / 2.0);

      text_pt2 = text_pt2 + (tail_dir * x_offset);
    }

    // Move from Origin to leader plane
    const ON_Plane& leaderplane = Plane();

    ON_2dVector text_dir(1.0, 0.0);     // Horizontal to cplane - ON_DimStyle::ContentAngleStyle::Horizontal
    if (ON_DimStyle::ContentAngleStyle::Aligned == textangle_style)
    {
      text_dir = tail_dir;
      if (text_dir.x < 0.0)
        text_dir = -text_dir;
    }
    else if (ON_DimStyle::ContentAngleStyle::Rotated == textangle_style)
    {
      text_dir = tail_dir;  // Already has rotation included
    }
    if (!text_dir.Unitize())
      text_dir.Set(1.0, 0.0);

    ON_Xform textscale_xf(ON_Xform::DiagonalTransformation(dimscale));
    ON_Xform textcenter_xf(ON_Xform::IdentityTransformation);        // Centers text block at origin
    ON_Xform textrotation_xf(ON_Xform::IdentityTransformation);      // Text rotation around origin

    ON_Xform world_to_leader_xf(ON_Xform::IdentityTransformation);   // WCS plane to leader plane rotation
    world_to_leader_xf.Rotation(ON_Plane::World_xy, leaderplane);    // Rotate text from starting text plane (wcs) to leader plane

    ON_Xform leader_to_text_pt_xf(ON_Xform::IdentityTransformation); // Leader plane to text point translation
    leader_to_text_pt_xf = ON_Xform::TranslationTransformation(text_pt2);

    textrotation_xf.Rotation(text_dir.y, text_dir.x, ON_3dVector::ZAxis, ON_3dPoint::Origin);

    textcenter_xf.m_xform[0][3] = -text_center.x;
    textcenter_xf.m_xform[1][3] = -text_center.y + text_shift.y;

    if (ON::TextOrientation::InView == dimstyle->LeaderTextOrientation())
    {
      const ON_Plane& ldrplane = Plane();
      ON_3dPoint text_point_3d = Plane().PointAt(text_pt2.x, text_pt2.y);
      textrotation_xf.Rotation(text_point_3d, ldrplane.xaxis, ldrplane.yaxis, ldrplane.zaxis, text_point_3d, view_x, view_y, view_z);
      text_xform_out = textscale_xf * textcenter_xf;
      text_xform_out = leader_to_text_pt_xf * text_xform_out;
      text_xform_out = world_to_leader_xf * text_xform_out;
      text_xform_out = textrotation_xf * text_xform_out;
      return true;
    }
    else if (dimstyle->DrawForward())
    {
      if (dimstyle->DrawForward())
      {
        // Check if the text is right-reading by comparing
        // text plane x and y, rotated by text rotation angle,
        // to view right and up

        ON_3dVector text_xdir = leaderplane.xaxis;
        ON_3dVector text_ydir = leaderplane.yaxis;
        ON_3dVector text_zdir = leaderplane.zaxis;
        if (text_zdir * view_z < 0.0)
        {
          ON_Xform xfr = textrotation_xf.Inverse();
          text_xdir.Transform(xfr);
          text_ydir.Transform(xfr);
          text_zdir.Transform(xfr);
        }
        else
        {
          text_xdir.Transform(textrotation_xf);
          text_ydir.Transform(textrotation_xf);
          text_zdir.Transform(textrotation_xf);
        }

        if (nullptr != model_xform)
        {
          text_xdir.Transform(*model_xform);
          text_ydir.Transform(*model_xform);
          text_zdir.Transform(*model_xform);
        }

        bool flip_x = false;
        bool flip_y = false;
        const double fliptol = (nullptr != vp && vp->Projection() == ON::view_projection::perspective_view) ? 0.0 : cos(88.0 * ON_DEGREES_TO_RADIANS);
        CalcTextFlip(
          text_xdir, text_ydir, text_zdir,
          view_x, view_y, view_z,
          model_xform,
          fliptol,
          flip_x,
          flip_y);

        ON_Xform mxf;
        if (flip_x)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::XAxis);
          textscale_xf = textscale_xf * mxf;
        }
        if (flip_y)
        {
          mxf.Mirror(ON_3dPoint::Origin, ON_3dVector::YAxis);
          textscale_xf = textscale_xf * mxf;
        }
      }
    }

    text_xform_out = textscale_xf * textcenter_xf;
    text_xform_out = textrotation_xf * text_xform_out;
    text_xform_out = leader_to_text_pt_xf * text_xform_out;
    text_xform_out = world_to_leader_xf * text_xform_out;
  }
  return true;
}